

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O2

void __thiscall HACD::MyMicroAllocator::removeMicroChunk(MyMicroAllocator *this,MemoryChunk *chunk)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  
  this->mLastMicroChunk = (MicroChunk *)0x0;
  lVar6 = 0x20;
  uVar7 = 0;
  while( true ) {
    if (this->mMicroChunkCount == uVar7) {
      return;
    }
    if (*(MemoryChunk **)((long)this->mMicroChunks + lVar6 + -0x10) == chunk) break;
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x20;
  }
  uVar8 = this->mMicroChunkCount - 1;
  this->mMicroChunkCount = uVar8;
  for (; uVar7 < uVar8; uVar7 = uVar7 + 1) {
    puVar1 = (undefined8 *)((long)&this->mMicroChunks->mMemStart + lVar6);
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    puVar2 = (undefined8 *)((long)&this->mMicroChunks[-1].mMemStart + lVar6);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    puVar2[2] = uVar4;
    puVar2[3] = uVar5;
    lVar6 = lVar6 + 0x20;
    uVar8 = this->mMicroChunkCount;
  }
  return;
}

Assistant:

virtual void removeMicroChunk(MemoryChunk *chunk)
  {
    mLastMicroChunk = 0;
    #ifdef _DEBUG
    bool removed = false;
    #endif
    for (NxU32 i=0; i<mMicroChunkCount; i++)
    {
        if ( mMicroChunks[i].mChunk == chunk )
        {
            mMicroChunkCount--;
            for (NxU32 j=i; j<mMicroChunkCount; j++)
            {
                mMicroChunks[j] = mMicroChunks[j+1];
            }
            #ifdef _DEBUG
            removed = true;
            #endif
            break;
        }
    }
#ifdef _DEBUG
    assert(removed);
#endif
  }